

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::c_formatter<spdlog::details::scoped_padder>::format
          (c_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  buffer<char> *buf;
  ulong uVar8;
  char *buf_ptr;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  scoped_padder p;
  uint local_68 [5];
  char local_53 [3];
  char *local_50;
  scoped_padder local_48;
  
  scoped_padder::scoped_padder(&local_48,0x18,&(this->super_flag_formatter).padinfo_,dest);
  pcVar3 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar5 = strlen(pcVar3);
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar3,pcVar3 + sVar5);
  sVar6 = (dest->super_buffer<char>).size_;
  uVar8 = sVar6 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar6] = ' ';
  pcVar3 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar5 = strlen(pcVar3);
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar3,pcVar3 + sVar5);
  sVar6 = (dest->super_buffer<char>).size_;
  uVar8 = sVar6 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar6] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  local_50 = ::fmt::v11::detail::do_format_decimal<char,unsigned_int>((char *)local_68,uVar4,0x15);
  if ((int)uVar1 < 0) {
    local_50[-1] = '-';
    local_50 = local_50 + -1;
  }
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_50,local_53);
  sVar6 = (dest->super_buffer<char>).size_;
  uVar8 = sVar6 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar6] = ' ';
  uVar1 = tm_time->tm_hour;
  if (uVar1 < 100) {
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
      sVar6 = (dest->super_buffer<char>).size_;
      uVar8 = sVar6 + 1;
    }
    bVar7 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar6] = bVar7 | 0x30;
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
      sVar6 = (dest->super_buffer<char>).size_;
      uVar8 = sVar6 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar6] = (char)uVar1 + bVar7 * -10 | 0x30;
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_68;
    args.desc_ = 1;
    local_68[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  sVar6 = (dest->super_buffer<char>).size_;
  uVar8 = sVar6 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar6] = ':';
  uVar1 = tm_time->tm_min;
  if (uVar1 < 100) {
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
      sVar6 = (dest->super_buffer<char>).size_;
      uVar8 = sVar6 + 1;
    }
    bVar7 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar6] = bVar7 | 0x30;
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
      sVar6 = (dest->super_buffer<char>).size_;
      uVar8 = sVar6 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar6] = (char)uVar1 + bVar7 * -10 | 0x30;
  }
  else {
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)local_68;
    args_00.desc_ = 1;
    local_68[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args_00,(locale_ref)0x0);
  }
  sVar6 = (dest->super_buffer<char>).size_;
  uVar8 = sVar6 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar6] = ':';
  uVar1 = tm_time->tm_sec;
  if (uVar1 < 100) {
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
      sVar6 = (dest->super_buffer<char>).size_;
      uVar8 = sVar6 + 1;
    }
    bVar7 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar6] = bVar7 | 0x30;
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
      sVar6 = (dest->super_buffer<char>).size_;
      uVar8 = sVar6 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar6] = (char)uVar1 + bVar7 * -10 | 0x30;
  }
  else {
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ = (value<fmt::v11::context> *)local_68;
    args_01.desc_ = 1;
    local_68[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_01,args_01,(locale_ref)0x0);
  }
  sVar6 = (dest->super_buffer<char>).size_;
  uVar8 = sVar6 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar8);
    sVar6 = (dest->super_buffer<char>).size_;
    uVar8 = sVar6 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar6] = ' ';
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  local_50 = ::fmt::v11::detail::do_format_decimal<char,unsigned_int>((char *)local_68,uVar4,0x15);
  if (iVar2 < -0x76c) {
    local_50[-1] = '-';
    local_50 = local_50 + -1;
  }
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_50,local_53);
  scoped_padder::~scoped_padder(&local_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }